

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O2

TestLog * glu::operator<<(TestLog *log,ShaderInfo *shaderInfo)

{
  size_t __n;
  void *__buf;
  LogShader local_60;
  
  __n = (size_t)shaderInfo->compileOk;
  tcu::LogShader::LogShader
            (&local_60,getLogShaderType::s_typeMap[shaderInfo->type],&shaderInfo->source,
             shaderInfo->compileOk,&shaderInfo->infoLog);
  tcu::LogShader::write(&local_60,(int)log,__buf,__n);
  tcu::LogShader::~LogShader(&local_60);
  return log;
}

Assistant:

tcu::TestLog& operator<< (tcu::TestLog& log, const ShaderInfo& shaderInfo)
{
	return log << tcu::TestLog::Shader(getLogShaderType(shaderInfo.type), shaderInfo.source, shaderInfo.compileOk, shaderInfo.infoLog);
}